

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationX.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CRotationX<std::complex<float>_>::CRotationX(CRotationX<std::complex<float>_> *this)

{
  QRotationGate1<std::complex<float>_> *this_00;
  
  (this->super_QControlledGate2<std::complex<float>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<float>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004ee970;
  this_00 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
  QRotationGate1<std::complex<float>_>::QRotationGate1(this_00,1,0.0,false);
  (this_00->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_> =
       (QObject<std::complex<float>_>)&PTR_nbQubits_004eb4d0;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::RotationX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::RotationX<std::complex<float>_>_*,_false>._M_head_impl =
       (RotationX<std::complex<float>_> *)this_00;
  return;
}

Assistant:

CRotationX()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< RotationX< T > >( 1 , 0. ) )
        { }